

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::anon_unknown_119::ssl_server_name_callback_impl
          (anon_unknown_119 *this,stream_handle_type stream_handle,string *name,session_impl *si)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  element_type *peVar4;
  context *c;
  context_handle_type c_00;
  span<const_char> in;
  context *torrent_ctx;
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  element_type *local_68;
  undefined1 local_5c [7];
  bool valid;
  info_hash_t info_hash;
  session_impl *si_local;
  string *name_local;
  stream_handle_type stream_handle_local;
  
  info_hash.v2.m_number._M_elems._24_8_ = name;
  uVar2 = ::std::__cxx11::string::size();
  if (uVar2 < 0x28) {
    stream_handle_local._7_1_ = false;
  }
  else {
    info_hash_t::info_hash_t((info_hash_t *)local_5c);
    pcVar3 = (char *)::std::__cxx11::string::c_str();
    span<const_char>::span
              ((span<const_char> *)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pcVar3,0x28);
    pcVar3 = digest32<160L>::data((digest32<160L> *)local_5c);
    in.m_len = (difference_type)pcVar3;
    in.m_ptr = (char *)local_68;
    bVar1 = from_hex((aux *)t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi,in,(char *)si);
    if (bVar1) {
      if (info_hash.v2.m_number._M_elems._24_8_ == 0) {
        ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)local_80,(nullptr_t)0x0);
      }
      else {
        session_impl::find_torrent
                  ((session_impl *)local_90,(info_hash_t *)info_hash.v2.m_number._M_elems._24_8_);
        ::std::weak_ptr<libtorrent::aux::torrent>::lock
                  ((weak_ptr<libtorrent::aux::torrent> *)local_80);
        ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
                  ((weak_ptr<libtorrent::aux::torrent> *)local_90);
      }
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
      if (bVar1) {
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_80);
        bVar1 = torrent::is_ssl_torrent(peVar4);
        if (bVar1) {
          peVar4 = ::std::
                   __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_80);
          c = torrent::ssl_ctx(peVar4);
          if (c == (context *)0x0) {
            stream_handle_local._7_1_ = false;
          }
          else {
            c_00 = aux::ssl::get_handle(c);
            aux::ssl::set_context((stream_handle_type)this,c_00);
            stream_handle_local._7_1_ = true;
          }
        }
        else {
          stream_handle_local._7_1_ = false;
        }
      }
      else {
        stream_handle_local._7_1_ = false;
      }
      ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                ((shared_ptr<libtorrent::aux::torrent> *)local_80);
    }
    else {
      stream_handle_local._7_1_ = false;
    }
  }
  return stream_handle_local._7_1_;
}

Assistant:

bool ssl_server_name_callback_impl(ssl::stream_handle_type stream_handle, std::string const& name, session_impl* si)
	{
		if (name.size() < 40)
			return false;

		info_hash_t info_hash;
		bool valid = aux::from_hex({name.c_str(), 40}, info_hash.v1.data());

		// the server name is not a valid hex-encoded info-hash
		if (!valid)
			return false;

		// see if there is a torrent with this info-hash
		std::shared_ptr<torrent> t = si ? si->find_torrent(info_hash).lock() : nullptr;

		// if there isn't, fail
		if (!t) return false;

		// if the torrent we found isn't an SSL torrent, also fail.
		if (!t->is_ssl_torrent()) return false;

		// if the torrent doesn't have an SSL context and should not allow
		// incoming SSL connections
		auto* torrent_ctx = t->ssl_ctx();
		if (!torrent_ctx) return false;

		// use this torrent's certificate
		ssl::set_context(stream_handle, ssl::get_handle(*torrent_ctx));
		return true;
	}